

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_model.c
# Opt level: O3

void free_mtl_lib(mtl_lib *mtl_lib)

{
  long lVar1;
  ulong uVar2;
  
  if (mtl_lib->material_count != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      free(*(void **)((long)&mtl_lib->materials->name + lVar1));
      free(*(void **)((long)&mtl_lib->materials->map_ka + lVar1));
      free(*(void **)((long)&mtl_lib->materials->map_kd + lVar1));
      free(*(void **)((long)&mtl_lib->materials->map_ks + lVar1));
      free(*(void **)((long)&mtl_lib->materials->map_ke + lVar1));
      free(*(void **)((long)&mtl_lib->materials->map_bump + lVar1));
      free(*(void **)((long)&mtl_lib->materials->map_d + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x88;
    } while (uVar2 < mtl_lib->material_count);
  }
  free(mtl_lib->materials);
  free(mtl_lib);
  return;
}

Assistant:

void free_mtl_lib(struct mtl_lib* mtl_lib) {
    for (size_t i = 0; i < mtl_lib->material_count; ++i) {
        free(mtl_lib->materials[i].name);
        free(mtl_lib->materials[i].map_ka);
        free(mtl_lib->materials[i].map_kd);
        free(mtl_lib->materials[i].map_ks);
        free(mtl_lib->materials[i].map_ke);
        free(mtl_lib->materials[i].map_bump);
        free(mtl_lib->materials[i].map_d);
    }
    free(mtl_lib->materials);
    free(mtl_lib);
}